

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImGuiWindowSettings local_3c;
  ImGuiID local_2c;
  ImGuiWindowSettings *pIStack_28;
  ImGuiID id;
  ImGuiWindowSettings *settings;
  char *name_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *param_0_local;
  
  settings = (ImGuiWindowSettings *)name;
  name_local = (char *)param_2;
  param_1_local = (ImGuiSettingsHandler *)param_1;
  pIStack_28 = ImGui::FindOrCreateWindowSettings(name);
  local_2c = pIStack_28->ID;
  ImGuiWindowSettings::ImGuiWindowSettings(&local_3c);
  pIStack_28->ID = local_3c.ID;
  pIStack_28->Pos = local_3c.Pos;
  pIStack_28->Size = local_3c.Size;
  pIStack_28->Collapsed = local_3c.Collapsed;
  pIStack_28->WantApply = local_3c.WantApply;
  pIStack_28->ID = local_2c;
  pIStack_28->WantApply = true;
  return pIStack_28;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindOrCreateWindowSettings(name);
    ImGuiID id = settings->ID;
    *settings = ImGuiWindowSettings(); // Clear existing if recycling previous entry
    settings->ID = id;
    settings->WantApply = true;
    return (void*)settings;
}